

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k051649.c
# Opt level: O0

void k051649_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  DEV_SMPL DVar6;
  DEV_SMPL *__s;
  DEV_SMPL *pDVar7;
  UINT32 offs;
  UINT32 step;
  UINT32 c;
  INT16 v;
  INT8 *w;
  UINT32 j;
  UINT32 i;
  DEV_SMPL *buffer2;
  DEV_SMPL *buffer;
  k051649_sound_channel *voice;
  k051649_state *info;
  DEV_SMPL **outputs_local;
  UINT32 samples_local;
  void *param_local;
  
  __s = *outputs;
  pDVar7 = outputs[1];
  memset(__s,0,(ulong)samples << 2);
  for (w._0_4_ = 0; (uint)w < 5; w._0_4_ = (uint)w + 1) {
    if ((8 < *(int *)((long)param + (ulong)(uint)w * 0x2c + 0xc)) &&
       (*(char *)((long)param + (ulong)(uint)w * 0x2c + 0x32) == '\0')) {
      bVar1 = *(byte *)((long)param + (ulong)(uint)w * 0x2c + 0x10);
      bVar2 = *(byte *)((long)param + (ulong)(uint)w * 0x2c + 0x11);
      offs = *(UINT32 *)((long)param + (ulong)(uint)w * 0x2c + 8);
      uVar3 = *(uint *)((long)param + 0xe4);
      iVar4 = *(int *)((long)param + 0xe8);
      iVar5 = *(int *)((long)param + (ulong)(uint)w * 0x2c + 0xc);
      for (w._4_4_ = 0; w._4_4_ < samples; w._4_4_ = w._4_4_ + 1) {
        offs = (int)(long)((float)((ulong)uVar3 << 0x10) /
                           ((float)(uint)((iVar5 + 1) * iVar4) * 0.5) + 0.5) + offs;
        __s[w._4_4_] = ((int)*(char *)((long)param +
                                      (ulong)(offs >> 0x10 & 0x1f) + (ulong)(uint)w * 0x2c + 0x12) *
                        (int)(short)((ushort)bVar1 * (ushort)bVar2) >> 3) + __s[w._4_4_];
      }
      *(UINT32 *)((long)param + (ulong)(uint)w * 0x2c + 8) = offs;
    }
  }
  for (w._4_4_ = 0; w._4_4_ < samples; w._4_4_ = w._4_4_ + 1) {
    DVar6 = *(DEV_SMPL *)(*(long *)((long)param + 0xf8) + (long)__s[w._4_4_] * 4);
    pDVar7[w._4_4_] = DVar6;
    __s[w._4_4_] = DVar6;
  }
  return;
}

Assistant:

static void k051649_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	k051649_state *info = (k051649_state *)param;
	k051649_sound_channel *voice=info->channel_list;
	DEV_SMPL *buffer = outputs[0];
	DEV_SMPL *buffer2 = outputs[1];
	UINT32 i,j;

	// zap the contents of the mixer buffer
	memset(buffer, 0, samples * sizeof(DEV_SMPL));

	for (j = 0; j < 5; j++)
	{
		// channel is halted for freq < 9
		if (voice[j].frequency > 8 && ! voice[j].Muted)
		{
			const INT8 *w = voice[j].waveram;
			INT16 v=voice[j].volume * voice[j].key;
			UINT32 c=voice[j].counter;
			//UINT32 step = (UINT32)(((INT64)info->mclock * (1 << FREQ_BITS)) / (float)((voice[j].frequency + 1) * 16 * (info->rate / 32)) + 0.5);
			UINT32 step = (UINT32)(((INT64)info->mclock * (1 << FREQ_BITS)) / (float)((voice[j].frequency + 1) * info->rate / 2.0f) + 0.5f);

			// add our contribution
			for (i = 0; i < samples; i++)
			{
				UINT32 offs;

				c += step;
				offs = (c >> FREQ_BITS) & 0x1f;
				buffer[i] += (w[offs] * v)>>3;
			}

			// update the counter for this voice
			voice[j].counter = c;
		}
	}

	// mix it down
	for (i = 0; i < samples; i++)
	{
		buffer[i] = buffer2[i] = info->mixer_lookup[buffer[i]];
	}
}